

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall cmFindBaseDebugState::~cmFindBaseDebugState(cmFindBaseDebugState *this)

{
  cmFindBase *pcVar1;
  pointer pDVar2;
  size_type sVar3;
  pointer pcVar4;
  string_view sep;
  cmAlphaNum *pcVar5;
  cmAlphaNum *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  DebugLibState *state;
  pointer pDVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view prefix;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_12;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_13;
  string_view suffix;
  string local_110;
  string path;
  bool local_b3;
  bool local_b2;
  bool local_b1;
  string local_b0;
  string *local_90;
  string *local_88;
  size_type local_80;
  char *local_78;
  undefined8 local_70;
  string buffer;
  
  if ((this->FindCommand->super_cmFindCommon).DebugMode == true) {
    local_b0._M_string_length = (size_type)(this->CommandName)._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)(this->CommandName)._M_string_length;
    local_b0.field_2._M_allocated_capacity = 0;
    local_b0.field_2._8_8_ = 0x25;
    local_90 = (string *)0x83f340;
    local_88 = (string *)0x0;
    views._M_len = 2;
    views._M_array = (iterator)&local_b0;
    cmCatViews(&buffer,views);
    local_b0._M_dataplus._M_p = (pointer)0x7;
    local_b0._M_string_length = 0x83f366;
    local_b0.field_2._M_allocated_capacity = 0;
    local_90 = (string *)(this->FindCommand->VariableName)._M_dataplus._M_p;
    local_b0.field_2._8_8_ = (this->FindCommand->VariableName)._M_string_length;
    local_88 = (string *)0x0;
    local_80 = 1;
    local_78 = "\n";
    local_70 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_b0;
    cmCatViews(&path,views_00);
    std::__cxx11::string::_M_append
              ((char *)&buffer,CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p) != &path.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p),
                      path.field_2._M_allocated_capacity + 1);
    }
    sep._M_str = "\n         ";
    sep._M_len = 10;
    prefix._M_str = "\"";
    prefix._M_len = 1;
    suffix._M_str = "\"";
    suffix._M_len = 1;
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_110,prefix,&this->FindCommand->Names,suffix,sep);
    local_b0._M_dataplus._M_p = (pointer)0x9;
    local_b0._M_string_length = 0x83f36e;
    local_b0.field_2._M_allocated_capacity = 0;
    local_b0.field_2._8_8_ = local_110._M_string_length;
    local_80 = 1;
    local_78 = "\n";
    local_70 = 0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)&local_b0;
    local_88 = &local_110;
    cmCatViews(&path,views_01);
    std::__cxx11::string::_M_append
              ((char *)&buffer,CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p) != &path.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p),
                      path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p) !=
        &local_110.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p),
                      local_110.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = &DAT_00000011;
    local_b0._M_string_length = 0x83f383;
    local_b0.field_2._M_allocated_capacity = 0;
    local_90 = (string *)(this->FindCommand->VariableDocumentation)._M_dataplus._M_p;
    local_b0.field_2._8_8_ = (this->FindCommand->VariableDocumentation)._M_string_length;
    local_88 = (string *)0x0;
    local_80 = 1;
    local_78 = "\n";
    local_70 = 0;
    views_02._M_len = 3;
    views_02._M_array = (iterator)&local_b0;
    cmCatViews(&path,views_02);
    std::__cxx11::string::_M_append
              ((char *)&buffer,CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p) != &path.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p),
                      path.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&buffer);
    local_b0._M_dataplus._M_p = (pointer)0x1c;
    local_b0._M_string_length = 0x83f3a2;
    local_b0.field_2._M_allocated_capacity = 0;
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,(uint)(this->FindCommand->super_cmFindCommon).SearchFrameworkOnly
              );
    pcVar5 = (cmAlphaNum *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p);
    pcVar6 = pcVar5;
    if (pcVar5 == (cmAlphaNum *)0x0) {
      pcVar6 = (cmAlphaNum *)&path.field_2;
    }
    local_90 = pcVar6->RValueString_;
    pcVar6 = (cmAlphaNum *)&path;
    if (pcVar5 != (cmAlphaNum *)0x0) {
      pcVar6 = pcVar5;
    }
    local_b0.field_2._8_8_ = (pcVar6->View_)._M_len;
    local_80 = 1;
    local_78 = "\n";
    local_70 = 0;
    views_03._M_len = 3;
    views_03._M_array = (iterator)&local_b0;
    cmCatViews(&local_110,views_03);
    std::__cxx11::string::_M_append
              ((char *)&buffer,
               CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p) !=
        &local_110.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p),
                      local_110.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)0x1c;
    local_b0._M_string_length = 0x83f3bf;
    local_b0.field_2._M_allocated_capacity = 0;
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,(uint)(this->FindCommand->super_cmFindCommon).SearchFrameworkLast
              );
    pcVar5 = (cmAlphaNum *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p);
    pcVar6 = pcVar5;
    if (pcVar5 == (cmAlphaNum *)0x0) {
      pcVar6 = (cmAlphaNum *)&path.field_2;
    }
    local_90 = pcVar6->RValueString_;
    pcVar6 = (cmAlphaNum *)&path;
    if (pcVar5 != (cmAlphaNum *)0x0) {
      pcVar6 = pcVar5;
    }
    local_b0.field_2._8_8_ = (pcVar6->View_)._M_len;
    local_80 = 1;
    local_78 = "\n";
    local_70 = 0;
    views_04._M_len = 3;
    views_04._M_array = (iterator)&local_b0;
    cmCatViews(&local_110,views_04);
    std::__cxx11::string::_M_append
              ((char *)&buffer,
               CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p) !=
        &local_110.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p),
                      local_110.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)0x1d;
    local_b0._M_string_length = 0x83f3dc;
    local_b0.field_2._M_allocated_capacity = 0;
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,
               (uint)(this->FindCommand->super_cmFindCommon).SearchFrameworkFirst);
    pcVar5 = (cmAlphaNum *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p);
    pcVar6 = pcVar5;
    if (pcVar5 == (cmAlphaNum *)0x0) {
      pcVar6 = (cmAlphaNum *)&path.field_2;
    }
    local_90 = pcVar6->RValueString_;
    pcVar6 = (cmAlphaNum *)&path;
    if (pcVar5 != (cmAlphaNum *)0x0) {
      pcVar6 = pcVar5;
    }
    local_b0.field_2._8_8_ = (pcVar6->View_)._M_len;
    local_80 = 1;
    local_78 = "\n";
    local_70 = 0;
    views_05._M_len = 3;
    views_05._M_array = (iterator)&local_b0;
    cmCatViews(&local_110,views_05);
    std::__cxx11::string::_M_append
              ((char *)&buffer,
               CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p) !=
        &local_110.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p),
                      local_110.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&buffer);
    local_b0._M_dataplus._M_p = (pointer)0x1b;
    local_b0._M_string_length = 0x83f407;
    local_b0.field_2._M_allocated_capacity = 0;
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,(uint)(this->FindCommand->super_cmFindCommon).SearchAppBundleOnly
              );
    pcVar5 = (cmAlphaNum *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p);
    pcVar6 = pcVar5;
    if (pcVar5 == (cmAlphaNum *)0x0) {
      pcVar6 = (cmAlphaNum *)&path.field_2;
    }
    local_90 = pcVar6->RValueString_;
    pcVar6 = (cmAlphaNum *)&path;
    if (pcVar5 != (cmAlphaNum *)0x0) {
      pcVar6 = pcVar5;
    }
    local_b0.field_2._8_8_ = (pcVar6->View_)._M_len;
    local_80 = 1;
    local_78 = "\n";
    local_70 = 0;
    views_06._M_len = 3;
    views_06._M_array = (iterator)&local_b0;
    cmCatViews(&local_110,views_06);
    std::__cxx11::string::_M_append
              ((char *)&buffer,
               CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p) !=
        &local_110.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p),
                      local_110.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)0x1b;
    local_b0._M_string_length = 0x83f423;
    local_b0.field_2._M_allocated_capacity = 0;
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,(uint)(this->FindCommand->super_cmFindCommon).SearchAppBundleLast
              );
    pcVar5 = (cmAlphaNum *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p);
    pcVar6 = pcVar5;
    if (pcVar5 == (cmAlphaNum *)0x0) {
      pcVar6 = (cmAlphaNum *)&path.field_2;
    }
    local_90 = pcVar6->RValueString_;
    pcVar6 = (cmAlphaNum *)&path;
    if (pcVar5 != (cmAlphaNum *)0x0) {
      pcVar6 = pcVar5;
    }
    local_b0.field_2._8_8_ = (pcVar6->View_)._M_len;
    local_80 = 1;
    local_78 = "\n";
    local_70 = 0;
    views_07._M_len = 3;
    views_07._M_array = (iterator)&local_b0;
    cmCatViews(&local_110,views_07);
    std::__cxx11::string::_M_append
              ((char *)&buffer,
               CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p) !=
        &local_110.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p),
                      local_110.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)0x1c;
    local_b0._M_string_length = 0x83f43f;
    local_b0.field_2._M_allocated_capacity = 0;
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,
               (uint)(this->FindCommand->super_cmFindCommon).SearchAppBundleFirst);
    pcVar5 = (cmAlphaNum *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p);
    pcVar6 = pcVar5;
    if (pcVar5 == (cmAlphaNum *)0x0) {
      pcVar6 = (cmAlphaNum *)&path.field_2;
    }
    local_90 = pcVar6->RValueString_;
    pcVar6 = (cmAlphaNum *)&path;
    if (pcVar5 != (cmAlphaNum *)0x0) {
      pcVar6 = pcVar5;
    }
    local_b0.field_2._8_8_ = (pcVar6->View_)._M_len;
    local_80 = 1;
    local_78 = "\n";
    local_70 = 0;
    views_08._M_len = 3;
    views_08._M_array = (iterator)&local_b0;
    cmCatViews(&local_110,views_08);
    std::__cxx11::string::_M_append
              ((char *)&buffer,
               CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p) !=
        &local_110.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p),
                      local_110.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = this->FindCommand;
    if ((pcVar1->super_cmFindCommon).NoDefaultPath == true) {
      std::__cxx11::string::append((char *)&buffer);
    }
    else {
      path._M_dataplus._M_p._0_1_ = (pcVar1->super_cmFindCommon).NoCMakePath ^ 1;
      local_110._M_dataplus._M_p._0_1_ = (pcVar1->super_cmFindCommon).NoCMakeEnvironmentPath ^ 1;
      local_b1 = (bool)((pcVar1->super_cmFindCommon).NoSystemEnvironmentPath ^ 1);
      local_b2 = (bool)((pcVar1->super_cmFindCommon).NoCMakeSystemPath ^ 1);
      local_b3 = (bool)((pcVar1->super_cmFindCommon).NoCMakeInstallPath ^ 1);
      cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>
                (&local_b0,(char (*) [30])"  CMAKE_FIND_USE_CMAKE_PATH: ",(bool *)&path,
                 (char (*) [2])0x825c4e,(char (*) [42])"  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",
                 (bool *)&local_110,(char (*) [2])0x825c4e,
                 (char (*) [43])"  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",&local_b1,
                 (char (*) [2])0x825c4e,(char (*) [37])"  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",
                 &local_b2,(char (*) [2])0x825c4e,(char (*) [34])"  CMAKE_FIND_USE_INSTALL_PREFIX: "
                 ,&local_b3,(char (*) [2])0x825c4e);
      std::__cxx11::string::_M_append((char *)&buffer,(ulong)local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    local_b0._M_string_length = (size_type)(this->CommandName)._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)(this->CommandName)._M_string_length;
    local_b0.field_2._M_allocated_capacity = 0;
    local_b0.field_2._8_8_ = 0x25;
    local_90 = (string *)0x83f531;
    local_88 = (string *)0x0;
    views_09._M_len = 2;
    views_09._M_array = (iterator)&local_b0;
    cmCatViews(&path,views_09);
    std::__cxx11::string::_M_append
              ((char *)&buffer,CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p) != &path.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p),
                      path.field_2._M_allocated_capacity + 1);
    }
    pDVar8 = (this->FailedSearchLocations).
             super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (this->FailedSearchLocations).
             super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pDVar8 != pDVar2) {
      do {
        local_b0._M_dataplus._M_p = (pointer)0x2;
        local_b0._M_string_length = 0x802f03;
        local_b0.field_2._M_allocated_capacity = 0;
        local_90 = (string *)(pDVar8->path)._M_dataplus._M_p;
        local_b0.field_2._8_8_ = (pDVar8->path)._M_string_length;
        local_88 = (string *)0x0;
        views_10._M_len = 2;
        views_10._M_array = (iterator)&local_b0;
        cmCatViews(&path,views_10);
        if ((pDVar8->regexName)._M_string_length != 0) {
          local_b0._M_string_length =
               CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p);
          local_b0._M_dataplus._M_p = (pointer)path._M_string_length;
          local_b0.field_2._M_allocated_capacity = 0;
          local_b0.field_2._8_8_ = 1;
          local_90 = (string *)0x89d511;
          local_88 = (string *)0x0;
          local_78 = (pDVar8->regexName)._M_dataplus._M_p;
          local_80 = (pDVar8->regexName)._M_string_length;
          local_70 = 0;
          views_11._M_len = 3;
          views_11._M_array = (iterator)&local_b0;
          cmCatViews(&local_110,views_11);
          std::__cxx11::string::operator=((string *)&path,(string *)&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p) !=
              &local_110.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_110._M_dataplus._M_p._1_7_,
                                     (byte)local_110._M_dataplus._M_p),
                            local_110.field_2._M_allocated_capacity + 1);
          }
        }
        local_b0._M_string_length =
             CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p);
        local_b0._M_dataplus._M_p = (pointer)path._M_string_length;
        local_b0.field_2._M_allocated_capacity = 0;
        local_b0.field_2._8_8_ = 1;
        local_90 = (string *)0x825c4e;
        local_88 = (string *)0x0;
        views_12._M_len = 2;
        views_12._M_array = (iterator)&local_b0;
        cmCatViews(&local_110,views_12);
        std::__cxx11::string::_M_append
                  ((char *)&buffer,
                   CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p) !=
            &local_110.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_110._M_dataplus._M_p._1_7_,(byte)local_110._M_dataplus._M_p
                                  ),local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p) != &path.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p),
                          path.field_2._M_allocated_capacity + 1);
        }
        pDVar8 = pDVar8 + 1;
      } while (pDVar8 != pDVar2);
    }
    sVar3 = (this->FoundSearchLocation).path._M_string_length;
    if (sVar3 == 0) {
      std::__cxx11::string::append((char *)&buffer);
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)0x18;
      local_b0._M_string_length = 0x83f557;
      local_b0.field_2._M_allocated_capacity = 0;
      local_90 = (string *)(this->FoundSearchLocation).path._M_dataplus._M_p;
      local_88 = (string *)0x0;
      local_80 = 1;
      local_78 = "\n";
      local_70 = 0;
      views_13._M_len = 3;
      views_13._M_array = (iterator)&local_b0;
      local_b0.field_2._8_8_ = sVar3;
      cmCatViews(&path,views_13);
      std::__cxx11::string::_M_append
                ((char *)&buffer,CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p) != &path.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(path._M_dataplus._M_p._1_7_,(byte)path._M_dataplus._M_p),
                        path.field_2._M_allocated_capacity + 1);
      }
    }
    cmFindCommon::DebugMessage(&this->FindCommand->super_cmFindCommon,&buffer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)buffer._M_dataplus._M_p != &buffer.field_2) {
      operator_delete(buffer._M_dataplus._M_p,buffer.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar4 = (this->FoundSearchLocation).path._M_dataplus._M_p;
  paVar7 = &(this->FoundSearchLocation).path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar7) {
    operator_delete(pcVar4,paVar7->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->FoundSearchLocation).regexName._M_dataplus._M_p;
  paVar7 = &(this->FoundSearchLocation).regexName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar7) {
    operator_delete(pcVar4,paVar7->_M_allocated_capacity + 1);
  }
  std::
  vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ::~vector(&this->FailedSearchLocations);
  pcVar4 = (this->CommandName)._M_dataplus._M_p;
  paVar7 = &(this->CommandName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar7) {
    operator_delete(pcVar4,paVar7->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmFindBaseDebugState::~cmFindBaseDebugState()
{
  if (this->FindCommand->DebugMode) {
    std::string buffer =
      cmStrCat(this->CommandName, " called with the following settings:\n");
    buffer += cmStrCat("  VAR: ", this->FindCommand->VariableName, "\n");
    buffer += cmStrCat(
      "  NAMES: ", cmWrap("\"", this->FindCommand->Names, "\"", "\n         "),
      "\n");
    buffer += cmStrCat(
      "  Documentation: ", this->FindCommand->VariableDocumentation, "\n");
    buffer += "  Framework\n";
    buffer += cmStrCat("    Only Search Frameworks: ",
                       this->FindCommand->SearchFrameworkOnly, "\n");

    buffer += cmStrCat("    Search Frameworks Last: ",
                       this->FindCommand->SearchFrameworkLast, "\n");
    buffer += cmStrCat("    Search Frameworks First: ",
                       this->FindCommand->SearchFrameworkFirst, "\n");
    buffer += "  AppBundle\n";
    buffer += cmStrCat("    Only Search AppBundle: ",
                       this->FindCommand->SearchAppBundleOnly, "\n");
    buffer += cmStrCat("    Search AppBundle Last: ",
                       this->FindCommand->SearchAppBundleLast, "\n");
    buffer += cmStrCat("    Search AppBundle First: ",
                       this->FindCommand->SearchAppBundleFirst, "\n");

    if (this->FindCommand->NoDefaultPath) {
      buffer += "  NO_DEFAULT_PATH Enabled\n";
    } else {
      buffer += cmStrCat(
        "  CMAKE_FIND_USE_CMAKE_PATH: ", !this->FindCommand->NoCMakePath, "\n",
        "  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoCMakeEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoSystemEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",
        !this->FindCommand->NoCMakeSystemPath, "\n",
        "  CMAKE_FIND_USE_INSTALL_PREFIX: ",
        !this->FindCommand->NoCMakeInstallPath, "\n");
    }

    buffer +=
      cmStrCat(this->CommandName, " considered the following locations:\n");
    for (auto const& state : this->FailedSearchLocations) {
      std::string path = cmStrCat("  ", state.path);
      if (!state.regexName.empty()) {
        path = cmStrCat(path, "/", state.regexName);
      }
      buffer += cmStrCat(path, "\n");
    }

    if (!this->FoundSearchLocation.path.empty()) {
      buffer += cmStrCat("The item was found at\n  ",
                         this->FoundSearchLocation.path, "\n");
    } else {
      buffer += "The item was not found.\n";
    }

    this->FindCommand->DebugMessage(buffer);
  }
}